

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassInfo.h
# Opt level: O3

void __thiscall ClassInfo::reset_temps(ClassInfo *this)

{
  pointer piVar1;
  pointer piVar2;
  
  piVar1 = (this->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
  }
  piVar1 = (this->tmpm).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->tmpm).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
  }
  piVar1 = (this->tmpl).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->tmpl).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
    return;
  }
  return;
}

Assistant:

void reset_temps() {
        std::fill(tmpe.begin(), tmpe.end(), 0);
        std::fill(tmpm.begin(), tmpm.end(), 0);
        std::fill(tmpl.begin(), tmpl.end(), 0);
    }